

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O1

MRIStepCoupling MRIStepCoupling_LoadTableByName(char *method)

{
  int **ppiVar1;
  int *piVar2;
  sunrealtype **ppsVar3;
  sunrealtype ***pppsVar4;
  int iVar5;
  sunrealtype *psVar6;
  ARKodeButcherTable B;
  MRIStepCoupling pMVar7;
  sunrealtype sVar8;
  int p;
  ARKODE_ERKTableID emethod;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  
  iVar5 = strcmp("ARKODE_MRI_NONE",method);
  if (iVar5 == 0) {
    return (MRIStepCoupling)0x0;
  }
  iVar5 = strcmp("ARKODE_MRI_GARK_FORWARD_EULER",method);
  if (iVar5 == 0) {
    emethod = ARKODE_FORWARD_EULER_1_1;
  }
  else {
    iVar5 = strcmp("ARKODE_MRI_GARK_RALSTON2",method);
    if (iVar5 == 0) {
      emethod = ARKODE_RALSTON_EULER_2_1_2;
    }
    else {
      iVar5 = strcmp("ARKODE_MIS_KW3",method);
      if (iVar5 == 0) {
        emethod = ARKODE_KNOTH_WOLKE_3_3;
      }
      else {
        iVar5 = strcmp("ARKODE_MRI_GARK_ERK22a",method);
        if (iVar5 == 0) {
          emethod = ARKODE_EXPLICIT_MIDPOINT_EULER_2_1_2;
        }
        else {
          iVar5 = strcmp("ARKODE_MRI_GARK_ERK22b",method);
          if (iVar5 != 0) {
            iVar5 = strcmp("ARKODE_MRI_GARK_ERK33a",method);
            if (iVar5 == 0) {
              pMVar7 = MRIStepCoupling_Alloc(2,4,MRISTEP_EXPLICIT);
              pMVar7->q = 3;
              pMVar7->p = 2;
              psVar6 = pMVar7->c;
              psVar6[1] = 0.3333333333333333;
              psVar6[2] = 0.6666666666666666;
              psVar6[3] = 1.0;
              pppsVar4 = pMVar7->W;
              ppsVar3 = *pppsVar4;
              *ppsVar3[1] = 0.3333333333333333;
              psVar6 = ppsVar3[2];
              *psVar6 = -0.3333333333333333;
              psVar6[1] = 0.6666666666666666;
              psVar6 = ppsVar3[3];
              psVar6[1] = -0.6666666666666666;
              psVar6[2] = 1.0;
              psVar6 = ppsVar3[4];
              *psVar6 = 0.08333333333333333;
              psVar6[1] = -0.3333333333333333;
              psVar6[2] = 0.5833333333333334;
              psVar6 = pppsVar4[1][3];
              *psVar6 = 0.5;
              sVar8 = -0.5;
LAB_0014f3ba:
              psVar6[2] = sVar8;
              return pMVar7;
            }
            iVar5 = strcmp("ARKODE_MRI_GARK_RALSTON3",method);
            if (iVar5 == 0) {
              pMVar7 = MRIStepCoupling_Alloc(2,4,MRISTEP_EXPLICIT);
              pMVar7->q = 3;
              pMVar7->p = 2;
              psVar6 = pMVar7->c;
              psVar6[1] = 0.5;
              psVar6[2] = 0.75;
              psVar6[3] = 1.0;
              pppsVar4 = pMVar7->W;
              ppsVar3 = *pppsVar4;
              *ppsVar3[1] = 0.5;
              psVar6 = ppsVar3[2];
              *psVar6 = -2.75;
              psVar6[1] = 3.0;
              psVar6 = ppsVar3[3];
              *psVar6 = 1.3055555555555556;
              psVar6[1] = -0.16666666666666666;
              psVar6[2] = -0.8888888888888888;
              psVar6 = ppsVar3[4];
              *psVar6 = 0.025;
              psVar6[1] = 0.175;
              psVar6[2] = 0.05;
              ppsVar3 = pppsVar4[1];
              psVar6 = ppsVar3[2];
              *psVar6 = 4.5;
              psVar6[1] = -4.5;
              psVar6 = ppsVar3[3];
              *psVar6 = -2.1666666666666665;
              psVar6[1] = -0.5;
              sVar8 = 2.6666666666666665;
              goto LAB_0014f3ba;
            }
            iVar5 = strcmp("ARKODE_MRI_GARK_ERK45a",method);
            if (iVar5 == 0) {
              pMVar7 = MRIStepCoupling_Alloc(2,6,MRISTEP_EXPLICIT);
              pMVar7->q = 4;
              pMVar7->p = 3;
              psVar6 = pMVar7->c;
              psVar6[1] = 0.2;
              psVar6[2] = 0.4;
              psVar6[3] = 0.6;
              psVar6[4] = 0.8;
              psVar6[5] = 1.0;
              pppsVar4 = pMVar7->W;
              ppsVar3 = *pppsVar4;
              *ppsVar3[1] = 0.2;
              psVar6 = ppsVar3[2];
              *psVar6 = -3.3125;
              psVar6[1] = 3.5125;
              psVar6 = ppsVar3[3];
              *psVar6 = -0.5121234603937985;
              psVar6[1] = 1.9554969207875972;
              psVar6[2] = -1.2433734603937985;
              psVar6 = ppsVar3[4];
              *psVar6 = -0.10689272115871615;
              psVar6[1] = -4.6566930569811165;
              psVar6[2] = 3.994968532757531;
              psVar6[3] = 0.9686172453823019;
              psVar6 = ppsVar3[5];
              *psVar6 = 0.911960843690752;
              psVar6[1] = -0.1837327083772207;
              psVar6[2] = -1.1939268660908644;
              psVar6[3] = -2.6119830068113195;
              psVar6[4] = 3.2776817375886527;
              psVar6 = ppsVar3[6];
              *psVar6 = -1.8585843690752053;
              psVar6[1] = 2.2246676060069692;
              psVar6[2] = -0.5244469581796045;
              psVar6[3] = -0.09396291472257937;
              psVar6[4] = 0.45232663597042;
              ppsVar3 = pppsVar4[1];
              psVar6 = ppsVar3[2];
              *psVar6 = 6.2875;
              psVar6[1] = -6.2875;
              psVar6 = ppsVar3[3];
              *psVar6 = -0.0382530792124029;
              psVar6[1] = 0.6952561584248058;
              psVar6[2] = -0.6570030792124029;
              psVar6 = ppsVar3[4];
              *psVar6 = 1.87616694642529;
              psVar6[1] = 3.0037681973833417;
              psVar6[2] = -3.0;
              psVar6[3] = -1.8799351438086316;
              psVar6 = ppsVar3[5];
              *psVar6 = -2.4238031914893616;
              psVar6[1] = 2.0;
              psVar6[2] = 1.0;
              psVar6[3] = 5.0;
              psVar6[4] = -5.576196808510638;
              psVar6 = ppsVar3[6];
              uVar9 = 0x4a139bc7;
              uVar10 = 0x400a7034;
              uVar11 = 0x4a139bc7;
              uVar12 = 0xc00a7034;
LAB_0014f52f:
              *(undefined4 *)psVar6 = uVar9;
              *(undefined4 *)((long)psVar6 + 4) = uVar10;
              *(undefined4 *)(psVar6 + 1) = uVar11;
              *(undefined4 *)((long)psVar6 + 0xc) = uVar12;
              return pMVar7;
            }
            iVar5 = strcmp("ARKODE_MRI_GARK_BACKWARD_EULER",method);
            if (iVar5 == 0) {
              pMVar7 = MRIStepCoupling_Alloc(1,3,MRISTEP_IMPLICIT);
              pMVar7->q = 1;
              pMVar7->p = 0;
              psVar6 = pMVar7->c;
              psVar6[1] = 1.0;
              psVar6[2] = 1.0;
              ppsVar3 = *pMVar7->G;
              sVar8 = 1.0;
              *ppsVar3[1] = 1.0;
              psVar6 = ppsVar3[2];
              *psVar6 = -1.0;
LAB_0014f67d:
              psVar6[2] = sVar8;
              return pMVar7;
            }
            iVar5 = strcmp("ARKODE_MRI_GARK_IRK21a",method);
            if (iVar5 != 0) {
              iVar5 = strcmp("ARKODE_MRI_GARK_IMPLICIT_MIDPOINT",method);
              if (iVar5 != 0) {
                iVar5 = strcmp("ARKODE_MRI_GARK_ESDIRK34a",method);
                if (iVar5 == 0) {
                  pMVar7 = MRIStepCoupling_Alloc(1,8,MRISTEP_IMPLICIT);
                  pMVar7->q = 3;
                  pMVar7->p = 2;
                  psVar6 = pMVar7->c;
                  psVar6[1] = 0.3333333333333333;
                  psVar6[2] = 0.3333333333333333;
                  psVar6[3] = 0.6666666666666666;
                  psVar6[4] = 0.6666666666666666;
                  psVar6[5] = 1.0;
                  psVar6[6] = 1.0;
                  psVar6[7] = 1.0;
                  ppsVar3 = *pMVar7->G;
                  *ppsVar3[1] = 0.3333333333333333;
                  psVar6 = ppsVar3[2];
                  *psVar6 = -0.435866521508459;
                  psVar6[2] = 0.435866521508459;
                  psVar6 = ppsVar3[3];
                  *psVar6 = -0.3045790611944505;
                  psVar6[2] = 0.6379123945277838;
                  psVar6 = ppsVar3[4];
                  *psVar6 = 0.21169131056402665;
                  psVar6[2] = -0.6475578320724856;
                  psVar6[4] = 0.435866521508459;
                  psVar6 = ppsVar3[5];
                  *psVar6 = 0.4454209388055495;
                  psVar6[2] = 0.8813784805616198;
                  psVar6[4] = -0.993466086033836;
                  psVar6 = ppsVar3[6];
                  *psVar6 = -0.435866521508459;
                  psVar6[6] = 0.435866521508459;
                  psVar6 = ppsVar3[8];
                  *psVar6 = 0.24538319991175245;
                  psVar6[2] = 0.4204215033044045;
                  psVar6[4] = -1.5769926063440662;
                  psVar6[6] = 0.9111879031279093;
                  return pMVar7;
                }
                iVar5 = strcmp("ARKODE_MRI_GARK_ESDIRK46a",method);
                if (iVar5 == 0) {
                  pMVar7 = MRIStepCoupling_Alloc(2,0xc,MRISTEP_IMPLICIT);
                  pMVar7->q = 4;
                  pMVar7->p = 3;
                  psVar6 = pMVar7->c;
                  psVar6[1] = 0.2;
                  psVar6[2] = 0.2;
                  psVar6[3] = 0.4;
                  psVar6[4] = 0.4;
                  psVar6[5] = 0.6;
                  psVar6[6] = 0.6;
                  psVar6[7] = 0.8;
                  psVar6[8] = 0.8;
                  psVar6[9] = 1.0;
                  psVar6[10] = 1.0;
                  psVar6[0xb] = 1.0;
                  pppsVar4 = pMVar7->G;
                  ppsVar3 = *pppsVar4;
                  *ppsVar3[1] = 0.2;
                  psVar6 = ppsVar3[2];
                  *psVar6 = -0.25;
                  psVar6[2] = 0.25;
                  psVar6 = ppsVar3[3];
                  *psVar6 = 0.9179311933794375;
                  psVar6[2] = -0.7179311933794374;
                  psVar6 = ppsVar3[4];
                  *psVar6 = 2.6431723539618277;
                  psVar6[2] = -2.8931723539618277;
                  psVar6[4] = 0.25;
                  psVar6 = ppsVar3[5];
                  *psVar6 = 0.501564151341775;
                  psVar6[2] = 0.06834736723773695;
                  psVar6[4] = -0.369911518579512;
                  psVar6 = ppsVar3[6];
                  *psVar6 = 4.342116951031425;
                  psVar6[2] = 0.03897604588394062;
                  psVar6[4] = -4.631092996915365;
                  psVar6[6] = 0.25;
                  psVar6 = ppsVar3[7];
                  *psVar6 = -1.6900149539119083;
                  psVar6[2] = 0.7232372452056922;
                  psVar6[4] = 1.84784916447243;
                  psVar6[6] = -0.681071455766214;
                  psVar6 = ppsVar3[8];
                  *psVar6 = 3.3152679948497616;
                  psVar6[2] = 1.0862351276543005;
                  psVar6[4] = -1.2024240374287367;
                  psVar6[6] = -3.4490790850753257;
                  psVar6[8] = 0.25;
                  psVar6 = ppsVar3[9];
                  *psVar6 = -1.563558636602688;
                  psVar6[2] = 1.0208839548357729;
                  psVar6[4] = 2.4893844266591256;
                  psVar6[6] = -0.18652827667797553;
                  psVar6[8] = -1.5601814682142348;
                  psVar6 = ppsVar3[10];
                  *psVar6 = 0.19;
                  psVar6[2] = -0.24333333333333335;
                  psVar6[4] = 0.42333333333333334;
                  psVar6[6] = 0.42333333333333334;
                  psVar6[8] = -1.0433333333333332;
                  psVar6[10] = 0.25;
                  psVar6 = ppsVar3[0xc];
                  *psVar6 = -0.25;
                  psVar6[2] = 0.6355065879145843;
                  psVar6[4] = -0.27771467514766013;
                  psVar6[6] = -0.4798955020445252;
                  psVar6[8] = 0.5009086778736938;
                  psVar6[10] = -0.1288050885960927;
                  ppsVar3 = pppsVar4[1];
                  psVar6 = ppsVar3[3];
                  *psVar6 = -1.735862386758875;
                  psVar6[2] = 1.735862386758875;
                  psVar6 = ppsVar3[4];
                  *psVar6 = -5.82844997108155;
                  psVar6[2] = 5.82844997108155;
                  psVar6 = ppsVar3[5];
                  *psVar6 = -0.4610230395256553;
                  psVar6[2] = -0.9787999976333687;
                  psVar6[4] = 1.439823037159024;
                  psVar6 = ppsVar3[6];
                  *psVar6 = -7.403989721900906;
                  psVar6[2] = 0.06115468960863698;
                  psVar6[4] = 7.342835032292269;
                  psVar6 = ppsVar3[7];
                  *psVar6 = 2.099785727661873;
                  psVar6[2] = -1.5855812717879028;
                  psVar6[4] = -2.9763473674063983;
                  psVar6[6] = 2.462142911532428;
                  psVar6 = ppsVar3[8];
                  *psVar6 = -5.523652150637583;
                  psVar6[2] = -1.829811152193671;
                  psVar6[4] = 1.8342166973064529;
                  psVar6[6] = 5.519246605524801;
                  psVar6 = ppsVar3[9];
                  *psVar6 = 2.0202334341434356;
                  psVar6[2] = -2.384427012786476;
                  psVar6[4] = -4.40813747576723;
                  psVar6[6] = 0.15196811798180143;
                  psVar6[8] = 4.62036293642847;
                  psVar6 = ppsVar3[10];
                  *psVar6 = 0.12;
                  psVar6[2] = -0.09666666666666666;
                  psVar6[4] = 0.23666666666666666;
                  psVar6[6] = 0.23666666666666666;
                  sVar8 = -0.49666666666666665;
LAB_0014fbfd:
                  psVar6[8] = sVar8;
                  return pMVar7;
                }
                iVar5 = strcmp("ARKODE_IMEX_MRI_GARK_EULER",method);
                if (iVar5 != 0) {
                  iVar5 = strcmp("ARKODE_IMEX_MRI_GARK_TRAPEZOIDAL",method);
                  if (iVar5 == 0) {
                    pMVar7 = MRIStepCoupling_Alloc(1,4,MRISTEP_IMEX);
                    pMVar7->q = 2;
                    pMVar7->p = 0;
                    psVar6 = pMVar7->c;
                    psVar6[1] = 1.0;
                    psVar6[2] = 1.0;
                    psVar6[3] = 1.0;
                    ppsVar3 = *pMVar7->W;
                    *ppsVar3[1] = 1.0;
                    psVar6 = ppsVar3[3];
                    *psVar6 = -0.5;
                    psVar6[2] = 0.5;
                    ppsVar3 = *pMVar7->G;
                    *ppsVar3[1] = 1.0;
                    psVar6 = ppsVar3[2];
                    *psVar6 = -0.5;
                  }
                  else {
                    iVar5 = strcmp("ARKODE_IMEX_MRI_GARK_MIDPOINT",method);
                    if (iVar5 != 0) {
                      iVar5 = strcmp("ARKODE_IMEX_MRI_GARK3a",method);
                      if (iVar5 == 0) {
                        pMVar7 = MRIStepCoupling_Alloc(1,8,MRISTEP_IMEX);
                        pMVar7->q = 3;
                        pMVar7->p = 0;
                        psVar6 = pMVar7->c;
                        psVar6[1] = 0.435866521508459;
                        psVar6[2] = 0.435866521508459;
                        psVar6[3] = 0.7179332607542295;
                        psVar6[4] = 0.7179332607542295;
                        psVar6[5] = 1.0;
                        psVar6[6] = 1.0;
                        psVar6[7] = 1.0;
                        ppsVar3 = *pMVar7->W;
                        *ppsVar3[1] = 0.435866521508459;
                        psVar6 = ppsVar3[3];
                        *psVar6 = -0.5688715801234401;
                        psVar6[2] = 0.8509383193692106;
                        psVar6 = ppsVar3[4];
                        *psVar6 = 0.4542839446436089;
                        psVar6[2] = -0.4542839446436089;
                        psVar6 = ppsVar3[5];
                        *psVar6 = -0.4271371821005074;
                        psVar6[2] = 0.1562747733103381;
                        psVar6[4] = 0.5529291480359398;
                        psVar6 = ppsVar3[7];
                        *psVar6 = 0.10585829607187965;
                        psVar6[2] = 0.6555675011400702;
                        psVar6[4] = -1.197292318720409;
                        psVar6[6] = 0.435866521508459;
                        ppsVar3 = *pMVar7->G;
                        *ppsVar3[1] = 0.435866521508459;
                        psVar6 = ppsVar3[2];
                        *psVar6 = -0.435866521508459;
                        psVar6[2] = 0.435866521508459;
                        psVar6 = ppsVar3[3];
                        *psVar6 = -0.4103336962288525;
                        psVar6[2] = 0.692400435474623;
                        psVar6 = ppsVar3[4];
                        *psVar6 = 0.4103336962288525;
                        psVar6[2] = -0.8462002177373115;
                        psVar6[4] = 0.435866521508459;
                        psVar6 = ppsVar3[5];
                        *psVar6 = 0.435866521508459;
                        psVar6[2] = 0.9264299099302395;
                        psVar6[4] = -1.080229692192928;
                        psVar6 = ppsVar3[6];
                        *psVar6 = -0.435866521508459;
                      }
                      else {
                        iVar5 = strcmp("ARKODE_IMEX_MRI_GARK3b",method);
                        if (iVar5 != 0) {
                          iVar5 = strcmp("ARKODE_IMEX_MRI_GARK4",method);
                          if (iVar5 == 0) {
                            pMVar7 = MRIStepCoupling_Alloc(2,0xc,MRISTEP_IMEX);
                            pMVar7->q = 4;
                            pMVar7->p = 0;
                            psVar6 = pMVar7->c;
                            psVar6[1] = 0.5;
                            psVar6[2] = 0.5;
                            psVar6[3] = 0.625;
                            psVar6[4] = 0.625;
                            psVar6[5] = 0.75;
                            psVar6[6] = 0.75;
                            psVar6[7] = 0.875;
                            psVar6[8] = 0.875;
                            psVar6[9] = 1.0;
                            psVar6[10] = 1.0;
                            psVar6[0xb] = 1.0;
                            pppsVar4 = pMVar7->W;
                            ppsVar3 = *pppsVar4;
                            *ppsVar3[1] = 0.5;
                            psVar6 = ppsVar3[3];
                            *psVar6 = -1.9171653436366287;
                            psVar6[2] = 2.0421653436366287;
                            psVar6 = ppsVar3[4];
                            *psVar6 = -0.40475103180110594;
                            psVar6[2] = 0.40475103180110594;
                            psVar6 = ppsVar3[5];
                            *psVar6 = 11.451466022492216;
                            psVar6[2] = -30.210757475265044;
                            psVar6[4] = 18.884291452772825;
                            psVar6 = ppsVar3[6];
                            *psVar6 = -0.7090335647602615;
                            psVar6[2] = 1.0303072085875187;
                            psVar6[4] = -0.3212736438272573;
                            psVar6 = ppsVar3[7];
                            *psVar6 = -29.995487164558284;
                            psVar6[2] = 37.6059827749918;
                            psVar6[4] = 0.3212736438272573;
                            psVar6[6] = -7.806769254260774;
                            psVar6 = ppsVar3[8];
                            *psVar6 = 3.104665054272962;
                            psVar6[2] = -2.4303250197571624;
                            psVar6[4] = -1.9054793011515245;
                            psVar6[6] = 1.2311392666357248;
                            psVar6 = ppsVar3[9];
                            *psVar6 = -2.4244295477520477;
                            psVar6[2] = 2.4303250197571624;
                            psVar6[4] = 1.9054793011515245;
                            psVar6[6] = -1.2311392666357248;
                            psVar6[8] = -0.5552355065209142;
                            psVar6 = ppsVar3[10];
                            *psVar6 = -0.010441350444797486;
                            psVar6[2] = 0.07260303614655074;
                            psVar6[4] = -0.1288275951677261;
                            psVar6[6] = 0.11293553500938236;
                            psVar6[8] = -0.04626962554340952;
                            psVar6 = ppsVar3[0xb];
                            *psVar6 = -0.8108522787762101;
                            psVar6[2] = 0.2560073199220492;
                            psVar6[4] = 0.8068294072697528;
                            psVar6[6] = -0.4557148228721824;
                            psVar6[8] = -0.04626962554340952;
                            psVar6[10] = 0.25;
                            ppsVar3 = pppsVar4[1];
                            psVar6 = ppsVar3[3];
                            *psVar6 = 4.084330687273257;
                            psVar6[2] = -4.084330687273257;
                            psVar6 = ppsVar3[5];
                            *psVar6 = -21.843429981382222;
                            psVar6[2] = 59.61201288692787;
                            psVar6[4] = -37.76858290554565;
                            psVar6 = ppsVar3[7];
                            *psVar6 = 61.65904145863709;
                            psVar6[2] = -77.27257996715863;
                            psVar6[6] = 15.613538508521549;
                            psVar6 = ppsVar3[9];
                            *psVar6 = -1.1104710130418285;
                            psVar6[8] = 1.1104710130418285;
                            pppsVar4 = pMVar7->G;
                            ppsVar3 = *pppsVar4;
                            *ppsVar3[1] = 0.5;
                            psVar6 = ppsVar3[2];
                            *psVar6 = -0.25;
                            psVar6[2] = 0.25;
                            psVar6 = ppsVar3[3];
                            *psVar6 = -3.977281248108488;
                            psVar6[2] = 4.102281248108488;
                            psVar6 = ppsVar3[4];
                            *psVar6 = -0.06905388741401691;
                            psVar6[2] = -0.1809461125859831;
                            psVar6[4] = 0.25;
                            psVar6 = ppsVar3[5];
                            *psVar6 = -1.7617676637579205;
                            psVar6[2] = 2.6945246983772986;
                            psVar6[4] = -0.8077570346193781;
                            psVar6 = ppsVar3[6];
                            *psVar6 = 0.555872179155397;
                            psVar6[2] = -0.6799140501579995;
                            psVar6[4] = -0.12595812899739744;
                            psVar6[6] = 0.25;
                            psVar6 = ppsVar3[7];
                            *psVar6 = -5.840176028724956;
                            psVar6[2] = 8.174456684291915;
                            psVar6[4] = 0.12595812899739744;
                            psVar6[6] = -2.3352387845643565;
                            psVar6 = ppsVar3[8];
                            *psVar6 = -1.9067926451678119;
                            psVar6[2] = -1.5470578113851239;
                            psVar6[4] = 4.12988801314935;
                            psVar6[6] = -0.9260375565964145;
                            psVar6[8] = 0.25;
                            psVar6 = ppsVar3[9];
                            *psVar6 = 3.337028151688726;
                            psVar6[2] = 1.5470578113851239;
                            psVar6[4] = -4.12988801314935;
                            psVar6[6] = 0.9260375565964145;
                            psVar6[8] = -1.5552355065209142;
                            psVar6 = ppsVar3[10];
                            *psVar6 = -0.8212936292210076;
                            psVar6[2] = 0.3286103560686;
                            psVar6[4] = 0.6780018121020267;
                            psVar6[6] = -0.34277928786280004;
                            psVar6[8] = -0.09253925108681904;
                            psVar6[10] = 0.25;
                            ppsVar3 = pppsVar4[1];
                            psVar6 = ppsVar3[3];
                            *psVar6 = 8.704562496216976;
                            psVar6[2] = -8.704562496216976;
                            psVar6 = ppsVar3[5];
                            *psVar6 = 3.911643102343875;
                            psVar6[2] = -5.027157171582631;
                            psVar6[4] = 1.1155140692387562;
                            psVar6 = ppsVar3[7];
                            *psVar6 = 10.818607699139118;
                            psVar6[2] = -14.98908526826783;
                            psVar6[6] = 4.170477569128713;
                            psVar6 = ppsVar3[9];
                            *psVar6 = -2.6104710130418285;
                            sVar8 = 2.6104710130418285;
                            goto LAB_0014fbfd;
                          }
                          iVar5 = strcmp("ARKODE_IMEX_MRI_SR21",method);
                          if (iVar5 != 0) {
                            iVar5 = strcmp("ARKODE_IMEX_MRI_SR32",method);
                            if (iVar5 == 0) {
                              pMVar7 = MRIStepCoupling_Alloc(2,5,MRISTEP_SR);
                              pMVar7->q = 3;
                              pMVar7->p = 2;
                              psVar6 = pMVar7->c;
                              psVar6[1] = 0.6764705882352942;
                              psVar6[2] = 0.8;
                              psVar6[3] = 1.1333333333333333;
                              psVar6[4] = 1.0;
                              pppsVar4 = pMVar7->W;
                              ppsVar3 = *pppsVar4;
                              *ppsVar3[1] = 0.6764705882352942;
                              psVar6 = ppsVar3[2];
                              *psVar6 = 1.0142857142857142;
                              psVar6[1] = -0.21428571428571427;
                              psVar6 = ppsVar3[3];
                              *psVar6 = 0.10735930735930736;
                              psVar6[1] = 0.5714285714285714;
                              psVar6[2] = 0.45454545454545453;
                              psVar6 = ppsVar3[4];
                              *psVar6 = 0.8641357630008525;
                              psVar6[1] = 0.08623188405797101;
                              psVar6[2] = 0.34375;
                              psVar6[3] = -0.29411764705882354;
                              psVar6 = ppsVar3[5];
                              *psVar6 = 1.0203249859689445;
                              psVar6[1] = -1.4838709677419355;
                              psVar6[2] = 1.9705882352941178;
                              psVar6[3] = -0.5070422535211268;
                              ppsVar3 = pppsVar4[1];
                              psVar6 = ppsVar3[2];
                              *psVar6 = -0.2264473168820995;
                              psVar6[1] = 0.2264473168820995;
                              psVar6 = ppsVar3[3];
                              *psVar6 = -1.7415039794633156;
                              psVar6[1] = 8.210746794478919;
                              psVar6[2] = -6.469242815015602;
                              psVar6 = pMVar7->W[1][4];
                              *psVar6 = -1.2954512170341839;
                              psVar6[1] = 2.560595940177763;
                              psVar6[2] = -2.104988533033297;
                              pMVar7->W[1][4][3] = 0.8398438098897179;
                              psVar6 = pMVar7->W[1][5];
                              *psVar6 = -1.6386815830309893;
                              psVar6[1] = 6.0831260274754335;
                              psVar6[2] = -5.777777777777778;
                              pMVar7->W[1][5][3] = 1.3333333333333333;
                              ppsVar3 = *pMVar7->G;
                              psVar6 = ppsVar3[1];
                              *psVar6 = -0.5714285714285714;
                              psVar6[1] = 0.5714285714285714;
                              psVar6 = ppsVar3[2];
                              *psVar6 = -0.8655695979919582;
                              psVar6[1] = 0.2941410265633868;
                              ppsVar3 = *pMVar7->G;
                              ppsVar3[2][2] = 0.5714285714285714;
                              *ppsVar3[3] = 1.211752194844657;
                              ppsVar3 = *pMVar7->G;
                              psVar6 = ppsVar3[3];
                              psVar6[1] = -2.2377262208186828;
                              psVar6[2] = 0.45454545454545453;
                              psVar6[3] = 0.5714285714285714;
                              *ppsVar3[4] = 0.021355814748372136;
                              psVar6 = (*pMVar7->G)[4];
                              psVar6[1] = -0.07308298152405064;
                              psVar6[2] = -0.20101452403881268;
                              psVar6[3] = -0.31868688061408024;
                              psVar6[4] = 0.5714285714285714;
                              psVar6 = (*pMVar7->G)[5];
                              *psVar6 = -0.043236714975845414;
                              psVar6[1] = 0.05514147688060732;
                              psVar6[2] = 0.07142857142857142;
                              psVar6[3] = -0.08333333333333333;
                              return pMVar7;
                            }
                            iVar5 = strcmp("ARKODE_IMEX_MRI_SR43",method);
                            if (iVar5 == 0) {
                              pMVar7 = MRIStepCoupling_Alloc(2,7,MRISTEP_SR);
                              pMVar7->q = 4;
                              pMVar7->p = 3;
                              psVar6 = pMVar7->c;
                              psVar6[1] = 0.25;
                              psVar6[2] = 0.75;
                              psVar6[3] = 0.55;
                              psVar6[4] = 0.5;
                              psVar6[5] = 1.0;
                              psVar6[6] = 1.0;
                              ppsVar3 = *pMVar7->W;
                              *ppsVar3[1] = 0.25;
                              *ppsVar3[2] = 1.125;
                              ppsVar3 = *pMVar7->W;
                              ppsVar3[2][1] = -0.375;
                              *ppsVar3[3] = 0.07991452991452991;
                              ppsVar3 = *pMVar7->W;
                              psVar6 = ppsVar3[3];
                              psVar6[1] = 0.7777777777777778;
                              psVar6[2] = -0.3076923076923077;
                              psVar6 = ppsVar3[4];
                              *psVar6 = 0.3878787878787879;
                              psVar6[1] = 0.16666666666666666;
                              ppsVar3 = *pMVar7->W;
                              psVar6 = ppsVar3[4];
                              psVar6[2] = -0.6;
                              psVar6[3] = 0.5454545454545454;
                              psVar6 = ppsVar3[5];
                              *psVar6 = 3.3076249271561773;
                              psVar6[1] = -0.2222222222222222;
                              ppsVar3 = *pMVar7->W;
                              psVar6 = ppsVar3[5];
                              psVar6[2] = -0.36363636363636365;
                              psVar6[3] = -0.16666666666666666;
                              psVar6[4] = -1.5550996746309247;
                              ppsVar3[6][1] = 0.6363636363636364;
                              psVar6 = (*pMVar7->W)[6];
                              psVar6[2] = -8.344696969696969;
                              psVar6[3] = 13.667929292929292;
                              psVar6[4] = -7.083333333333333;
                              psVar6[5] = 2.1237373737373737;
                              psVar6 = (*pMVar7->W)[7];
                              *psVar6 = 0.0025;
                              psVar6[1] = 4.083333333333333;
                              psVar6[2] = 7.166666666666667;
                              psVar6[3] = -0.7;
                              pppsVar4 = pMVar7->W;
                              psVar6 = (*pppsVar4)[7];
                              psVar6[4] = -7.083333333333333;
                              psVar6[5] = -2.4691666666666667;
                              psVar6 = pppsVar4[1][2];
                              *psVar6 = -2.75;
                              psVar6[1] = 2.75;
                              psVar6 = pMVar7->W[1][3];
                              *psVar6 = -0.4198290598290598;
                              psVar6[1] = -0.4088888888888889;
                              psVar6[2] = 0.8287179487179487;
                              psVar6 = pMVar7->W[1][4];
                              *psVar6 = -0.9169340463458111;
                              psVar6[1] = 0.6549019607843137;
                              psVar6[2] = 1.463235294117647;
                              pMVar7->W[1][4][3] = -1.2012032085561497;
                              psVar6 = pMVar7->W[1][5];
                              *psVar6 = -6.615249854312355;
                              psVar6[1] = 7.027777777777778;
                              psVar6[2] = -0.5227272727272727;
                              pMVar7->W[1][5][3] = 25.333333333333332;
                              pMVar7->W[1][5][4] = -25.223133984071485;
                              pMVar7->W[1][6][1] = 0.8106060606060606;
                              pMVar7->W[1][6][2] = 14.647727272727273;
                              pMVar7->W[1][6][3] = -11.710858585858587;
                              pMVar7->W[1][6][5] = -3.7474747474747474;
                              psVar6 = pMVar7->W[1][7];
                              *psVar6 = -0.005;
                              psVar6[1] = -5.708333333333333;
                              psVar6[2] = -14.6875;
                              pMVar7->W[1][7][3] = 15.4625;
                              pMVar7->W[1][7][5] = 4.9383333333333335;
                              ppsVar3 = *pMVar7->G;
                              psVar6 = ppsVar3[1];
                              *psVar6 = -0.25;
                              psVar6[1] = 0.25;
                              psVar6 = ppsVar3[2];
                              *psVar6 = 0.25;
                              psVar6[1] = -0.5;
                              ppsVar3 = *pMVar7->G;
                              ppsVar3[2][2] = 0.25;
                              *ppsVar3[3] = 0.13;
                              ppsVar3 = *pMVar7->G;
                              psVar6 = ppsVar3[3];
                              psVar6[1] = -0.23333333333333334;
                              psVar6[2] = -0.14666666666666667;
                              psVar6[3] = 0.25;
                              *ppsVar3[4] = 0.07058823529411765;
                              psVar6 = (*pMVar7->G)[4];
                              psVar6[1] = -0.2213235294117647;
                              psVar6[2] = -0.18198529411764705;
                              psVar6[3] = 0.08272058823529412;
                              psVar6[4] = 0.25;
                              psVar6 = (*pMVar7->G)[5];
                              psVar6[1] = -2.25;
                              psVar6[2] = -0.3958333333333333;
                              psVar6[3] = -4.6875;
                              psVar6[4] = 7.083333333333333;
                              (*pMVar7->G)[5][5] = 0.25;
                              return pMVar7;
                            }
                            iVar5 = strcmp("ARKODE_MERK21",method);
                            if (iVar5 == 0) {
                              pMVar7 = MRIStepCoupling_Alloc(2,3,MRISTEP_MERK);
                              pMVar7->q = 2;
                              pMVar7->p = 1;
                              pMVar7->ngroup = 2;
                              ppiVar1 = pMVar7->group;
                              piVar2 = *ppiVar1;
                              piVar2[0] = 1;
                              piVar2[1] = 3;
                              *ppiVar1[1] = 2;
                              psVar6 = pMVar7->c;
                              psVar6[1] = 0.5;
                              psVar6[2] = 1.0;
                              ppsVar3 = *pMVar7->W;
                              *ppsVar3[1] = 1.0;
                              *ppsVar3[2] = 1.0;
                              pppsVar4 = pMVar7->W;
                              *(*pppsVar4)[3] = 1.0;
                              *pppsVar4[1][2] = -2.0;
                              pMVar7->W[1][2][1] = 2.0;
                              return pMVar7;
                            }
                            iVar5 = strcmp("ARKODE_MERK32",method);
                            if (iVar5 != 0) {
                              iVar5 = strcmp("ARKODE_MERK43",method);
                              if (iVar5 == 0) {
                                pMVar7 = MRIStepCoupling_Alloc(3,7,MRISTEP_MERK);
                                pMVar7->q = 4;
                                pMVar7->p = 3;
                                pMVar7->ngroup = 4;
                                ppiVar1 = pMVar7->group;
                                **ppiVar1 = 1;
                                piVar2 = ppiVar1[1];
                                piVar2[0] = 3;
                                piVar2[1] = 2;
                                piVar2 = pMVar7->group[2];
                                piVar2[0] = 5;
                                piVar2[1] = 4;
                                piVar2[2] = 7;
                                *pMVar7->group[3] = 6;
                                psVar6 = pMVar7->c;
                                psVar6[1] = 0.5;
                                psVar6[2] = 0.5;
                                psVar6[3] = 0.3333333333333333;
                                psVar6[4] = 0.8333333333333334;
                                psVar6[5] = 0.3333333333333333;
                                psVar6[6] = 1.0;
                                ppsVar3 = *pMVar7->W;
                                *ppsVar3[1] = 1.0;
                                *ppsVar3[2] = 1.0;
                                ppsVar3 = *pMVar7->W;
                                *ppsVar3[3] = 1.0;
                                *ppsVar3[4] = 1.0;
                                ppsVar3 = *pMVar7->W;
                                *ppsVar3[5] = 1.0;
                                *ppsVar3[6] = 1.0;
                                pppsVar4 = pMVar7->W;
                                *(*pppsVar4)[7] = 1.0;
                                *pppsVar4[1][2] = -2.0;
                                pMVar7->W[1][2][1] = 2.0;
                                ppsVar3 = pMVar7->W[1];
                                psVar6 = ppsVar3[3];
                                *psVar6 = -2.0;
                                psVar6[1] = 2.0;
                                psVar6 = ppsVar3[4];
                                *psVar6 = -4.999999999999998;
                                psVar6[2] = -3.9999999999999996;
                                pMVar7->W[1][4][3] = 8.999999999999998;
                                psVar6 = pMVar7->W[1][5];
                                *psVar6 = -4.999999999999998;
                                psVar6[2] = -3.9999999999999996;
                                pMVar7->W[1][5][3] = 8.999999999999998;
                                psVar6 = pMVar7->W[1][6];
                                *psVar6 = -4.200000000000001;
                                psVar6[4] = -0.7999999999999999;
                                pMVar7->W[1][6][5] = 5.000000000000001;
                                psVar6 = pMVar7->W[1][7];
                                *psVar6 = -4.999999999999998;
                                psVar6[2] = -3.9999999999999996;
                                pMVar7->W[1][7][3] = 8.999999999999998;
                                psVar6 = pMVar7->W[2][4];
                                *psVar6 = 5.999999999999998;
                                psVar6[2] = 11.999999999999998;
                                pMVar7->W[2][4][3] = -17.999999999999996;
                                psVar6 = pMVar7->W[2][5];
                                *psVar6 = 5.999999999999998;
                                psVar6[2] = 11.999999999999998;
                                pMVar7->W[2][5][3] = -17.999999999999996;
                                psVar6 = pMVar7->W[2][6];
                                *psVar6 = 3.6;
                                psVar6[4] = 2.4;
                                pMVar7->W[2][6][5] = -6.0;
                                psVar6 = pMVar7->W[2][7];
                                *psVar6 = 5.999999999999998;
                                psVar6[2] = 11.999999999999998;
                                pMVar7->W[2][7][3] = -17.999999999999996;
                                return pMVar7;
                              }
                              iVar5 = strcmp("ARKODE_MERK54",method);
                              if (iVar5 != 0) {
                                arkProcessError((ARKodeMem)0x0,-0x16,0x3f,
                                                "MRIStepCoupling_LoadTableByName",
                                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_mri_tables.c"
                                                ,"Unknown coupling table");
                                return (MRIStepCoupling)0x0;
                              }
                              pMVar7 = MRIStepCoupling_Alloc(4,0xb,MRISTEP_MERK);
                              pMVar7->q = 5;
                              pMVar7->p = 4;
                              pMVar7->ngroup = 5;
                              ppiVar1 = pMVar7->group;
                              **ppiVar1 = 1;
                              piVar2 = ppiVar1[1];
                              piVar2[0] = 3;
                              piVar2[1] = 2;
                              piVar2 = pMVar7->group[2];
                              piVar2[0] = 6;
                              piVar2[1] = 5;
                              piVar2[2] = 4;
                              piVar2 = pMVar7->group[3];
                              piVar2[0] = 8;
                              piVar2[1] = 9;
                              piVar2[2] = 7;
                              ppiVar1 = pMVar7->group;
                              ppiVar1[3][3] = 0xb;
                              *ppiVar1[4] = 10;
                              psVar6 = pMVar7->c;
                              psVar6[1] = 0.5;
                              psVar6[2] = 0.5;
                              psVar6[3] = 0.3333333333333333;
                              psVar6[4] = 0.5;
                              psVar6[5] = 0.3333333333333333;
                              psVar6[6] = 0.25;
                              psVar6 = pMVar7->c;
                              psVar6[7] = 0.7;
                              psVar6[8] = 0.5;
                              psVar6[9] = 0.6666666666666666;
                              psVar6[10] = 1.0;
                              ppsVar3 = *pMVar7->W;
                              *ppsVar3[1] = 1.0;
                              *ppsVar3[2] = 1.0;
                              ppsVar3 = *pMVar7->W;
                              *ppsVar3[3] = 1.0;
                              *ppsVar3[4] = 1.0;
                              ppsVar3 = *pMVar7->W;
                              *ppsVar3[5] = 1.0;
                              *ppsVar3[6] = 1.0;
                              ppsVar3 = *pMVar7->W;
                              *ppsVar3[7] = 1.0;
                              *ppsVar3[8] = 1.0;
                              ppsVar3 = *pMVar7->W;
                              *ppsVar3[9] = 1.0;
                              *ppsVar3[10] = 1.0;
                              pppsVar4 = pMVar7->W;
                              *(*pppsVar4)[0xb] = 1.0;
                              *pppsVar4[1][2] = -2.0;
                              pMVar7->W[1][2][1] = 2.0;
                              ppsVar3 = pMVar7->W[1];
                              psVar6 = ppsVar3[3];
                              *psVar6 = -2.0;
                              psVar6[1] = 2.0;
                              psVar6 = ppsVar3[4];
                              *psVar6 = -4.999999999999998;
                              psVar6[2] = -3.9999999999999996;
                              pMVar7->W[1][4][3] = 8.999999999999998;
                              psVar6 = pMVar7->W[1][5];
                              *psVar6 = -4.999999999999998;
                              psVar6[2] = -3.9999999999999996;
                              pMVar7->W[1][5][3] = 8.999999999999998;
                              psVar6 = pMVar7->W[1][6];
                              *psVar6 = -4.999999999999998;
                              psVar6[2] = -3.9999999999999996;
                              pMVar7->W[1][6][3] = 8.999999999999998;
                              psVar6 = pMVar7->W[1][7];
                              *psVar6 = -9.000000000000007;
                              psVar6[4] = 3.9999999999999996;
                              pMVar7->W[1][7][5] = -27.0;
                              pMVar7->W[1][7][6] = 32.00000000000001;
                              psVar6 = pMVar7->W[1][8];
                              *psVar6 = -9.000000000000007;
                              psVar6[4] = 3.9999999999999996;
                              pMVar7->W[1][8][5] = -27.0;
                              pMVar7->W[1][8][6] = 32.00000000000001;
                              psVar6 = pMVar7->W[1][9];
                              *psVar6 = -9.000000000000007;
                              psVar6[4] = 3.9999999999999996;
                              pMVar7->W[1][9][5] = -27.0;
                              pMVar7->W[1][9][6] = 32.00000000000001;
                              psVar6 = pMVar7->W[1][10];
                              *psVar6 = -4.928571428571431;
                              psVar6[7] = 71.42857142857147;
                              pMVar7->W[1][10][8] = 28.000000000000007;
                              pMVar7->W[1][10][9] = -94.50000000000004;
                              psVar6 = pMVar7->W[1][0xb];
                              *psVar6 = -9.000000000000007;
                              psVar6[4] = 3.9999999999999996;
                              pMVar7->W[1][0xb][5] = -27.0;
                              pMVar7->W[1][0xb][6] = 32.00000000000001;
                              psVar6 = pMVar7->W[2][4];
                              *psVar6 = 5.999999999999998;
                              psVar6[2] = 11.999999999999998;
                              pMVar7->W[2][4][3] = -17.999999999999996;
                              psVar6 = pMVar7->W[2][5];
                              *psVar6 = 5.999999999999998;
                              psVar6[2] = 11.999999999999998;
                              pMVar7->W[2][5][3] = -17.999999999999996;
                              psVar6 = pMVar7->W[2][6];
                              *psVar6 = 5.999999999999998;
                              psVar6[2] = 11.999999999999998;
                              pMVar7->W[2][6][3] = -17.999999999999996;
                              psVar6 = pMVar7->W[2][7];
                              *psVar6 = 26.0;
                              psVar6[4] = -27.999999999999993;
                              pMVar7->W[2][7][5] = 162.00000000000003;
                              pMVar7->W[2][7][6] = -160.00000000000003;
                              psVar6 = pMVar7->W[2][8];
                              *psVar6 = 26.0;
                              psVar6[4] = -27.999999999999993;
                              pMVar7->W[2][8][5] = 162.00000000000003;
                              pMVar7->W[2][8][6] = -160.00000000000003;
                              psVar6 = pMVar7->W[2][9];
                              *psVar6 = 26.0;
                              psVar6[4] = -27.999999999999993;
                              pMVar7->W[2][9][5] = 162.00000000000003;
                              pMVar7->W[2][9][6] = -160.00000000000003;
                              psVar6 = pMVar7->W[2][10];
                              *psVar6 = 7.999999999999943;
                              psVar6[7] = -250.00000000000009;
                              pMVar7->W[2][10][8] = -82.00000000000004;
                              pMVar7->W[2][10][9] = 324.00000000000017;
                              psVar6 = pMVar7->W[2][0xb];
                              *psVar6 = 26.0;
                              psVar6[4] = -27.999999999999993;
                              pMVar7->W[2][0xb][5] = 162.00000000000003;
                              pMVar7->W[2][0xb][6] = -160.00000000000003;
                              psVar6 = pMVar7->W[3][7];
                              *psVar6 = -24.000000000000057;
                              psVar6[4] = 47.99999999999999;
                              pMVar7->W[3][7][5] = -216.0;
                              pMVar7->W[3][7][6] = 192.00000000000006;
                              psVar6 = pMVar7->W[3][8];
                              *psVar6 = -24.000000000000057;
                              psVar6[4] = 47.99999999999999;
                              pMVar7->W[3][8][5] = -216.0;
                              pMVar7->W[3][8][6] = 192.00000000000006;
                              psVar6 = pMVar7->W[3][9];
                              *psVar6 = -24.000000000000057;
                              psVar6[4] = 47.99999999999999;
                              pMVar7->W[3][9][5] = -216.0;
                              pMVar7->W[3][9][6] = 192.00000000000006;
                              psVar6 = pMVar7->W[3][10];
                              *psVar6 = -4.285714285714278;
                              psVar6[7] = 214.2857142857144;
                              pMVar7->W[3][10][8] = 60.00000000000002;
                              pMVar7->W[3][10][9] = -270.0000000000001;
                              psVar6 = pMVar7->W[3][0xb];
                              *psVar6 = -24.000000000000057;
                              psVar6[4] = 47.99999999999999;
                              pMVar7->W[3][0xb][5] = -216.0;
                              pMVar7->W[3][0xb][6] = 192.00000000000006;
                              return pMVar7;
                            }
                            pMVar7 = MRIStepCoupling_Alloc(2,4,MRISTEP_MERK);
                            pMVar7->q = 3;
                            pMVar7->p = 2;
                            pMVar7->ngroup = 3;
                            ppiVar1 = pMVar7->group;
                            **ppiVar1 = 1;
                            piVar2 = ppiVar1[1];
                            piVar2[0] = 2;
                            piVar2[1] = 4;
                            *pMVar7->group[2] = 3;
                            psVar6 = pMVar7->c;
                            psVar6[1] = 0.5;
                            psVar6[2] = 0.6666666666666666;
                            psVar6[3] = 1.0;
                            ppsVar3 = *pMVar7->W;
                            *ppsVar3[1] = 1.0;
                            *ppsVar3[2] = 1.0;
                            ppsVar3 = *pMVar7->W;
                            *ppsVar3[3] = 1.0;
                            *ppsVar3[4] = 1.0;
                            ppsVar3 = pMVar7->W[1];
                            psVar6 = ppsVar3[2];
                            uVar9 = 0;
                            uVar10 = 0xc0000000;
                            uVar11 = 0;
                            uVar12 = 0x40000000;
                            *(undefined4 *)psVar6 = 0;
                            *(undefined4 *)((long)psVar6 + 4) = 0xc0000000;
                            *(undefined4 *)(psVar6 + 1) = 0;
                            *(undefined4 *)((long)psVar6 + 0xc) = 0x40000000;
                            psVar6 = ppsVar3[3];
                            *psVar6 = -1.5;
                            psVar6[2] = 1.5;
                            psVar6 = pMVar7->W[1][4];
                            goto LAB_0014f52f;
                          }
                          pMVar7 = MRIStepCoupling_Alloc(1,4,MRISTEP_SR);
                          pMVar7->q = 2;
                          pMVar7->p = 1;
                          psVar6 = pMVar7->c;
                          psVar6[1] = 0.6;
                          psVar6[2] = 0.26666666666666666;
                          psVar6[3] = 1.0;
                          ppsVar3 = *pMVar7->W;
                          *ppsVar3[1] = 0.6;
                          psVar6 = ppsVar3[2];
                          *psVar6 = 0.08484848484848485;
                          psVar6[1] = 0.18181818181818182;
                          psVar6 = ppsVar3[3];
                          *psVar6 = -0.24074074074074073;
                          psVar6[1] = 0.5074074074074074;
                          psVar6[2] = 0.7333333333333333;
                          psVar6 = ppsVar3[4];
                          *psVar6 = -0.25;
                          psVar6[1] = 0.5;
                          psVar6[2] = 0.75;
                          ppsVar3 = *pMVar7->G;
                          psVar6 = ppsVar3[1];
                          *psVar6 = -0.4782608695652174;
                          psVar6[1] = 0.4782608695652174;
                          psVar6 = ppsVar3[2];
                          *psVar6 = -0.12778064195833572;
                          psVar6[1] = -0.3504802276068817;
                          psVar6[2] = 0.4782608695652174;
                          psVar6 = ppsVar3[3];
                          *psVar6 = 0.12817373657159245;
                          psVar6[1] = -0.9496349237862043;
                          psVar6[2] = 0.34320031764939446;
                          psVar6[3] = 0.4782608695652174;
                          psVar6 = ppsVar3[4];
                          *psVar6 = -2.5833333333333335;
                          psVar6[1] = -0.16666666666666666;
                          sVar8 = 2.75;
                          goto LAB_0014f3ba;
                        }
                        pMVar7 = MRIStepCoupling_Alloc(1,8,MRISTEP_IMEX);
                        pMVar7->q = 3;
                        pMVar7->p = 0;
                        psVar6 = pMVar7->c;
                        psVar6[1] = 0.435866521508459;
                        psVar6[2] = 0.435866521508459;
                        psVar6[3] = 0.7179332607542295;
                        psVar6[4] = 0.7179332607542295;
                        psVar6[5] = 1.0;
                        psVar6[6] = 1.0;
                        psVar6[7] = 1.0;
                        ppsVar3 = *pMVar7->W;
                        *ppsVar3[1] = 0.435866521508459;
                        psVar6 = ppsVar3[3];
                        *psVar6 = -0.17501452855704677;
                        psVar6[2] = 0.45708126780281727;
                        psVar6 = ppsVar3[4];
                        *psVar6 = 0.06042689307721552;
                        psVar6[2] = -0.06042689307721552;
                        psVar6 = ppsVar3[5];
                        *psVar6 = 0.11952139594254545;
                        psVar6[2] = -1.843725226689662;
                        psVar6[4] = 2.006270569992887;
                        psVar6 = ppsVar3[6];
                        *psVar6 = -0.5466585780430528;
                        psVar6[2] = 2.0;
                        psVar6[4] = -1.4533414219569472;
                        psVar6 = ppsVar3[7];
                        *psVar6 = 0.10585829607187965;
                        psVar6[2] = 0.6555675011400702;
                        psVar6[4] = -1.197292318720409;
                        psVar6[6] = 0.435866521508459;
                        ppsVar3 = *pMVar7->G;
                        *ppsVar3[1] = 0.435866521508459;
                        psVar6 = ppsVar3[2];
                        *psVar6 = -0.435866521508459;
                        psVar6[2] = 0.435866521508459;
                        psVar6 = ppsVar3[3];
                        *psVar6 = 0.04142737535644148;
                        psVar6[2] = 0.24063936388932902;
                        psVar6 = ppsVar3[4];
                        *psVar6 = -0.04142737535644148;
                        psVar6[2] = -0.39443914615201753;
                        psVar6[4] = 0.435866521508459;
                        psVar6 = ppsVar3[5];
                        *psVar6 = 0.11233731430060478;
                        psVar6[2] = 1.051807513648115;
                        psVar6[4] = -0.8820780887029493;
                        psVar6 = ppsVar3[6];
                        *psVar6 = -0.11233731430060478;
                        psVar6[2] = -0.12537760371787546;
                        psVar6[4] = -0.19815160348997876;
                      }
                      psVar6[6] = 0.435866521508459;
                      return pMVar7;
                    }
                    pMVar7 = MRIStepCoupling_Alloc(1,4,MRISTEP_IMEX);
                    pMVar7->q = 2;
                    pMVar7->p = 0;
                    psVar6 = pMVar7->c;
                    psVar6[1] = 0.5;
                    psVar6[2] = 0.5;
                    psVar6[3] = 1.0;
                    ppsVar3 = *pMVar7->W;
                    *ppsVar3[1] = 0.5;
                    psVar6 = ppsVar3[3];
                    *psVar6 = -0.5;
                    psVar6[2] = 1.0;
                    ppsVar3 = *pMVar7->G;
                    *ppsVar3[1] = 0.5;
                    psVar6 = ppsVar3[2];
                    *psVar6 = -0.5;
                    psVar6[2] = 0.5;
                    psVar6 = ppsVar3[3];
                  }
                  psVar6[2] = 0.5;
                  return pMVar7;
                }
                pMVar7 = MRIStepCoupling_Alloc(1,3,MRISTEP_IMEX);
                pMVar7->q = 1;
                pMVar7->p = 0;
                psVar6 = pMVar7->c;
                psVar6[1] = 1.0;
                psVar6[2] = 1.0;
                sVar8 = 1.0;
                *(*pMVar7->W)[1] = 1.0;
                ppsVar3 = *pMVar7->G;
                *ppsVar3[1] = 1.0;
                psVar6 = ppsVar3[2];
                *psVar6 = -1.0;
                goto LAB_0014f3ba;
              }
              pMVar7 = MRIStepCoupling_Alloc(1,4,MRISTEP_IMPLICIT);
              pMVar7->q = 2;
              pMVar7->p = 0;
              psVar6 = pMVar7->c;
              psVar6[1] = 0.5;
              psVar6[2] = 0.5;
              psVar6[3] = 1.0;
              ppsVar3 = *pMVar7->G;
              sVar8 = 0.5;
              *ppsVar3[1] = 0.5;
              psVar6 = ppsVar3[2];
              *psVar6 = -0.5;
              psVar6[2] = 0.5;
              psVar6 = ppsVar3[3];
              goto LAB_0014f67d;
            }
            B = ARKodeButcherTable_Alloc(3,1);
            B->q = 2;
            B->p = 1;
            psVar6 = B->c;
            psVar6[1] = 1.0;
            psVar6[2] = 1.0;
            ppsVar3 = B->A;
            *ppsVar3[1] = 1.0;
            psVar6 = ppsVar3[2];
            *psVar6 = 0.5;
            psVar6[2] = 0.5;
            psVar6 = B->b;
            *psVar6 = 0.5;
            psVar6[2] = 0.5;
            B->d[2] = 1.0;
            iVar5 = 2;
            p = 1;
            goto LAB_0014f227;
          }
          emethod = ARKODE_HEUN_EULER_2_1_2;
        }
      }
    }
  }
  B = ARKodeButcherTable_LoadERK(emethod);
  iVar5 = B->q;
  p = B->p;
LAB_0014f227:
  pMVar7 = MRIStepCoupling_MIStoMRI(B,iVar5,p);
  ARKodeButcherTable_Free(B);
  return pMVar7;
}

Assistant:

MRIStepCoupling MRIStepCoupling_LoadTableByName(const char* method)
{
#define ARK_MRI_TABLE(name, coeff) \
  if (strcmp(#name, method) == 0) coeff
#include "arkode_mri_tables.def"
#undef ARK_MRI_TABLE

  arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                  "Unknown coupling table");

  return NULL;
}